

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O1

void anon_unknown.dwarf_2ef16f::test(int nx,int ny)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ushort uVar4;
  unsigned_short uVar5;
  ostream *this;
  long *plVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  long lVar10;
  unsigned_short *puVar11;
  ulong uVar12;
  ulong uVar13;
  Array2D<unsigned_short> b;
  Array2D<unsigned_short> a;
  Rand48 rand48;
  Array2D<unsigned_short> local_70;
  Array2D<unsigned_short> local_58;
  ushort local_3e [3];
  long local_38;
  
  uVar1 = (ulong)(uint)ny;
  uVar2 = (ulong)(uint)nx;
  this = (ostream *)std::ostream::operator<<(&std::cout,nx);
  std::__ostream_insert<char,std::char_traits<char>>(this," x ",3);
  plVar6 = (long *)std::ostream::operator<<(this,ny);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  uVar13 = uVar2 * uVar1 * 2;
  local_58._sizeX = uVar1;
  local_58._sizeY = uVar2;
  puVar7 = (unsigned_short *)operator_new__(uVar13);
  local_70._sizeX = uVar1;
  local_70._sizeY = uVar2;
  local_58._data = puVar7;
  puVar8 = (unsigned_short *)operator_new__(uVar13);
  local_3e[0] = 0x5a5a;
  local_3e[1] = 0x5a5a;
  local_3e[2] = 0x5a5a;
  local_70._data = puVar8;
  if (0 < ny) {
    local_38 = uVar2 * 2;
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          uVar4 = Imath_2_5::nrand48(local_3e);
          puVar9[uVar12] = uVar4 & 0x3fff;
          puVar11[uVar12] = uVar4 & 0x3fff;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = (unsigned_short *)((long)puVar11 + local_38);
      puVar9 = (unsigned_short *)((long)puVar9 + local_38);
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    local_38 = uVar2 * 2;
    uVar13 = 0;
    puVar9 = puVar7;
    puVar11 = puVar8;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          uVar5 = Imath_2_5::nrand48(local_3e);
          puVar11[uVar12] = uVar5;
          puVar9[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar9 = (unsigned_short *)((long)puVar9 + local_38);
      puVar11 = (unsigned_short *)((long)puVar11 + local_38);
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    sVar3 = uVar2 * 2;
    lVar10 = 0;
    uVar13 = uVar1;
    do {
      if (0 < nx) {
        memset((void *)((long)puVar8 + lVar10),0,sVar3);
        memset((void *)((long)puVar7 + lVar10),0,sVar3);
      }
      lVar10 = lVar10 + sVar3;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          puVar9[uVar12] = 1;
          puVar11[uVar12] = 1;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          puVar9[uVar12] = 0x3ffe;
          puVar11[uVar12] = 0x3ffe;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          puVar9[uVar12] = 0x3fff;
          puVar11[uVar12] = 0x3fff;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          puVar9[uVar12] = 0xfffe;
          puVar11[uVar12] = 0xfffe;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    sVar3 = uVar2 * 2;
    lVar10 = 0;
    uVar13 = uVar1;
    do {
      if (0 < nx) {
        memset((void *)((long)puVar8 + lVar10),0xff,sVar3);
        memset((void *)((long)puVar7 + lVar10),0xff,sVar3);
      }
      lVar10 = lVar10 + sVar3;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          uVar5 = 0;
          if ((uVar12 & 1) == 0) {
            uVar5 = 0x3fff;
          }
          puVar9[uVar12] = uVar5;
          puVar11[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          uVar5 = ((ushort)uVar12 & 1) - 1;
          puVar9[uVar12] = uVar5;
          puVar11[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar5 = 0;
        if ((uVar13 & 1) == 0) {
          uVar5 = 0x3fff;
        }
        uVar12 = 0;
        do {
          puVar9[uVar12] = uVar5;
          puVar11[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar5 = ((ushort)uVar13 & 1) - 1;
        uVar12 = 0;
        do {
          puVar9[uVar12] = uVar5;
          puVar11[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          uVar5 = 0x3fff;
          if (((int)uVar13 + (int)uVar12 & 1U) != 0) {
            uVar5 = 0;
          }
          puVar9[uVar12] = uVar5;
          puVar11[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  if (0 < ny) {
    uVar13 = 0;
    puVar9 = puVar8;
    puVar11 = puVar7;
    do {
      if (0 < nx) {
        uVar12 = 0;
        do {
          uVar5 = ((short)uVar13 + (short)uVar12 & 1U) - 1;
          puVar9[uVar12] = uVar5;
          puVar11[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar13 != uVar1);
  }
  wavEncodeDecode(&local_58,&local_70,nx,ny);
  operator_delete__(puVar8);
  operator_delete__(puVar7);
  return;
}

Assistant:

void
test (int nx, int ny)
{
    cout << nx << " x " << ny << endl;

    Array2D<unsigned short> a (ny, nx);
    Array2D<unsigned short> b (ny, nx);

    IMATH_NAMESPACE::Rand48 rand48 (0);

    fill1_14bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill1_16bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 1);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3ffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3fff);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xfffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xffff);
    wavEncodeDecode (a, b, nx, ny);

    fill3_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill3_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);
}